

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarPdr(Abc_Ntk_t *pNtk,Pdr_Par_t *pPars)

{
  Abc_Cex_t *pAVar1;
  Vec_Ptr_t *__ptr;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAig;
  long lVar5;
  long lVar6;
  char *format;
  Abc_Ntk_t *pAVar7;
  Aig_Man_t *pAVar8;
  timespec ts;
  timespec local_38;
  
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pAVar7 = pNtk;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    Abc_Print((int)pAVar7,"Converting network into AIG has failed.\n");
    return -1;
  }
  pAVar8 = pAig;
  iVar2 = Pdr_ManSolve(pAig,pPars);
  iVar4 = (int)pAVar8;
  pPars->nDropOuts = (pAig->nTruePos - pPars->nProveOuts) - pPars->nFailOuts;
  if (pPars->fSilent != 0) goto LAB_0024ceb9;
  if (pPars->fSolveAll == 0) {
    if (iVar2 == -1) {
      format = "Property UNDECIDED.  ";
    }
    else if (iVar2 == 0) {
      pAVar1 = pAig->pSeqModel;
      if (pAVar1 == (Abc_Cex_t *)0x0) {
        format = "Abc_NtkDarPdr(): Counter-example is not available.\n";
      }
      else {
        Abc_Print(iVar4,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                  (ulong)(uint)pAVar1->iPo,pNtk->pName,(ulong)(uint)pAVar1->iFrame);
        pAVar8 = pAig;
        iVar3 = Saig_ManVerifyCex(pAig,pAig->pSeqModel);
        iVar4 = (int)pAVar8;
        if (iVar3 != 0) goto LAB_0024ce44;
        format = "Abc_NtkDarPdr(): Counter-example verification has FAILED.\n";
      }
    }
    else {
      if (iVar2 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0xbbf,"int Abc_NtkDarPdr(Abc_Ntk_t *, Pdr_Par_t *)");
      }
      format = "Property proved.  ";
    }
    Abc_Print(iVar4,format);
  }
  else {
    Abc_Print(iVar4,"Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ");
  }
LAB_0024ce44:
  Abc_Print(iVar4,"%s =","Time");
  iVar3 = 3;
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
LAB_0024ceb9:
  if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pNtk->pSeqModel);
    pNtk->pSeqModel = (Abc_Cex_t *)0x0;
  }
  pNtk->pSeqModel = pAig->pSeqModel;
  pAig->pSeqModel = (Abc_Cex_t *)0x0;
  __ptr = pNtk->vSeqModelVec;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar5 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar5]) {
          free(__ptr->pArray[lVar5]);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  pNtk->vSeqModelVec = pAig->vSeqModelVec;
  pAig->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Aig_ManStop(pAig);
  return iVar2;
}

Assistant:

int Abc_NtkDarPdr( Abc_Ntk_t * pNtk, Pdr_Par_t * pPars )
{
    int RetValue = -1;
    abctime clk = Abc_Clock();
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return -1;
    }
    RetValue = Pdr_ManSolve( pMan, pPars );
    pPars->nDropOuts = Saig_ManPoNum(pMan) - pPars->nProveOuts - pPars->nFailOuts;
    if ( !pPars->fSilent )
    {
        if ( pPars->fSolveAll )
            Abc_Print( 1, "Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ", 
                Saig_ManPoNum(pMan), pPars->nProveOuts, pPars->nFailOuts, pPars->nDropOuts );
        else if ( RetValue == 1 )
            Abc_Print( 1, "Property proved.  " );
        else 
        {
            if ( RetValue == 0 )
            {
                if ( pMan->pSeqModel == NULL )
                    Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example is not available.\n" );
                else
                {
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel->iPo, pNtk->pName, pMan->pSeqModel->iFrame );
                    if ( !Saig_ManVerifyCex( pMan, pMan->pSeqModel ) )
                        Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example verification has FAILED.\n" );
                }
            }
            else if ( RetValue == -1 )
                Abc_Print( 1, "Property UNDECIDED.  " );
            else
                assert( 0 );
        }
        ABC_PRT( "Time", Abc_Clock() - clk );
/*
        Abc_Print( 1, "Status: " );
        if ( pPars->pOutMap )
        {
            int i;
            for ( i = 0; i < Saig_ManPoNum(pMan); i++ )
                if ( pPars->pOutMap[i] == 1 )
                    Abc_Print( 1, "%d=%s ", i, "unsat" );
                else if ( pPars->pOutMap[i] == 0 )
                    Abc_Print( 1, "%d=%s ", i, "sat" );
                else if ( pPars->pOutMap[i] < 0 )
                    Abc_Print( 1, "%d=%s ", i, "undec" );
                else assert( 0 );
        }
        Abc_Print( 1, "\n" );
*/
    }
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel;
    pMan->pSeqModel = NULL;
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    pNtk->vSeqModelVec = pMan->vSeqModelVec;
    pMan->vSeqModelVec = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}